

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

State __thiscall QAccessibleTextEdit::state(QAccessibleTextEdit *this)

{
  bool bVar1;
  State SVar2;
  QWidget *this_00;
  uint uVar3;
  
  SVar2 = QAccessibleTextWidget::state(&this->super_QAccessibleTextWidget);
  this_00 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  bVar1 = QTextEdit::isReadOnly((QTextEdit *)this_00);
  uVar3 = SVar2._0_4_ | 0x100;
  if (!bVar1) {
    uVar3 = SVar2._0_4_;
  }
  return (State)((ulong)SVar2 & 0xaaaaaaff00000000 | (ulong)!bVar1 << 0x20 | (ulong)uVar3);
}

Assistant:

QAccessible::State QAccessibleTextEdit::state() const
{
    QAccessible::State st = QAccessibleTextWidget::state();
    if (textEdit()->isReadOnly())
        st.readOnly = true;
    else
        st.editable = true;
    return st;
}